

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_conn_config_match(Curl_easy *data,connectdata *candidate,_Bool proxy)

{
  Curl_easy *data_00;
  _Bool _Var1;
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  ssl_primary_config *c1;
  
  c1 = &candidate->proxy_ssl_config;
  data_00 = (Curl_easy *)&(data->set).proxy_ssl;
  if (CONCAT31(in_register_00000011,proxy) == 0) {
    c1 = &candidate->ssl_config;
    data_00 = (Curl_easy *)&(data->set).ssl;
  }
  _Var1 = match_ssl_primary_config
                    (data_00,c1,
                     (ssl_primary_config *)
                     CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,proxy)));
  return _Var1;
}

Assistant:

bool Curl_ssl_conn_config_match(struct Curl_easy *data,
                                struct connectdata *candidate,
                                bool proxy)
{
#ifndef CURL_DISABLE_PROXY
  if(proxy)
    return match_ssl_primary_config(data, &data->set.proxy_ssl.primary,
                                    &candidate->proxy_ssl_config);
#else
  (void)proxy;
#endif
  return match_ssl_primary_config(data, &data->set.ssl.primary,
                                  &candidate->ssl_config);
}